

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::PropertyInstance::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Property *prop,PropertyInstance *p_pcOut,bool p_bBE)

{
  EDataType eType;
  Property *bufferSize_00;
  uint *pCur_00;
  char **buffer_00;
  vector<char,_std::allocator<char>_> *streamBuffer_00;
  reference out;
  ValueUnion local_68;
  ValueUnion v_1;
  ValueUnion VStack_58;
  uint i;
  uint local_4c;
  ValueUnion VStack_48;
  uint iNum;
  ValueUnion v;
  PropertyInstance *pPStack_38;
  bool p_bBE_local;
  PropertyInstance *p_pcOut_local;
  Property *prop_local;
  uint *bufferSize_local;
  char **pCur_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  v._7_1_ = p_bBE;
  pPStack_38 = p_pcOut;
  p_pcOut_local = (PropertyInstance *)prop;
  prop_local = (Property *)bufferSize;
  bufferSize_local = (uint *)pCur;
  pCur_local = (char **)buffer;
  buffer_local = (vector<char,_std::allocator<char>_> *)streamBuffer;
  if (prop == (Property *)0x0) {
    __assert_fail("__null != prop",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x373,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
                 );
  }
  if (p_pcOut == (PropertyInstance *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x374,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Property *, PLY::PropertyInstance *, bool)"
                 );
  }
  if ((prop->bIsList & 1U) == 0) {
    ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eType,&local_68,p_bBE);
    std::
    vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
    ::push_back(&pPStack_38->avList,&local_68);
  }
  else {
    ParseValueBinary(streamBuffer,buffer,pCur,bufferSize,prop->eFirstType,&stack0xffffffffffffffb8,
                     p_bBE);
    VStack_58 = VStack_48;
    local_4c = ConvertTo<unsigned_int>
                         (VStack_48,
                          *(EDataType *)
                           ((long)&p_pcOut_local[1].avList.
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::
    vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
    ::resize(&pPStack_38->avList,(ulong)local_4c);
    for (v_1._4_4_ = 0; streamBuffer_00 = buffer_local, buffer_00 = pCur_local,
        pCur_00 = bufferSize_local, bufferSize_00 = prop_local, (uint)v_1._4_4_ < local_4c;
        v_1._4_4_ = v_1._4_4_ + 1) {
      eType = *(EDataType *)
               &(p_pcOut_local->avList).
                super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      out = std::
            vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
            ::operator[](&pPStack_38->avList,(ulong)(uint)v_1._4_4_);
      ParseValueBinary((IOStreamBuffer<char> *)streamBuffer_00,
                       (vector<char,_std::allocator<char>_> *)buffer_00,(char **)pCur_00,
                       &bufferSize_00->eType,eType,out,(bool)(v._7_1_ & 1));
    }
  }
  return true;
}

Assistant:

bool PLY::PropertyInstance::ParseInstanceBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Property* prop,
  PLY::PropertyInstance* p_pcOut,
  bool p_bBE)
{
  ai_assert(NULL != prop);
  ai_assert(NULL != p_pcOut);

  // parse all elements
  if (prop->bIsList)
  {
    // parse the number of elements in the list
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eFirstType, &v, p_bBE);

    // convert to unsigned int
    unsigned int iNum = PLY::PropertyInstance::ConvertTo<unsigned int>(v, prop->eFirstType);

    // parse all list elements
    p_pcOut->avList.resize(iNum);
    for (unsigned int i = 0; i < iNum; ++i)
    {
      PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &p_pcOut->avList[i], p_bBE);
    }
  }
  else
  {
    // parse the property
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValueBinary(streamBuffer, buffer, pCur, bufferSize, prop->eType, &v, p_bBE);
    p_pcOut->avList.push_back(v);
  }
  return true;
}